

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

CategoricalCrossEntropyLossLayer * __thiscall
CoreML::Specification::CategoricalCrossEntropyLossLayer::New
          (CategoricalCrossEntropyLossLayer *this,Arena *arena)

{
  CategoricalCrossEntropyLossLayer *this_00;
  
  this_00 = (CategoricalCrossEntropyLossLayer *)operator_new(0x28);
  CategoricalCrossEntropyLossLayer(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::CategoricalCrossEntropyLossLayer>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

CategoricalCrossEntropyLossLayer* CategoricalCrossEntropyLossLayer::New(::google::protobuf::Arena* arena) const {
  CategoricalCrossEntropyLossLayer* n = new CategoricalCrossEntropyLossLayer;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}